

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O0

void __thiscall
duckdb::TableStatistics::Initialize
          (TableStatistics *this,vector<duckdb::LogicalType,_true> *types,PersistentTableData *data)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  string *msg;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RSI;
  shared_ptr<std::mutex,_true> *in_RDI;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *in_stack_ffffffffffffff68;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *in_stack_ffffffffffffff70;
  allocator *this_00;
  shared_ptr<std::mutex,_true> *in_stack_ffffffffffffff78;
  allocator local_61;
  string local_60 [8];
  unsigned_long *in_stack_ffffffffffffffa8;
  
  make_shared_ptr<std::mutex>();
  shared_ptr<std::mutex,_true>::operator=(in_RDI,in_stack_ffffffffffffff78);
  shared_ptr<std::mutex,_true>::~shared_ptr((shared_ptr<std::mutex,_true> *)0xbad7cf);
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator=
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                      *)0xbad7fa);
  if (bVar1) {
    unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::operator=
              ((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                *)in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                *)in_stack_ffffffffffffff68);
  }
  else {
    make_uniq<duckdb::ReservoirSample,unsigned_long>(in_stack_ffffffffffffffa8);
    unique_ptr<duckdb::BlockingSample,std::default_delete<duckdb::BlockingSample>,true>::
    unique_ptr<duckdb::ReservoirSample,std::default_delete<std::unique_ptr<duckdb::BlockingSample,std::default_delete<duckdb::BlockingSample>>>,void>
              ((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                *)in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_> *
               )in_stack_ffffffffffffff68);
    unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::operator=
              ((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                *)in_stack_ffffffffffffff70,
               (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                *)in_stack_ffffffffffffff68);
    unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
    ~unique_ptr((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                 *)0xbad860);
    unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                 *)0xbad86a);
  }
  sVar2 = ::std::
          vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
          ::size((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                  *)(in_RDI + 1));
  sVar3 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(in_RSI);
  if (sVar2 != sVar3) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_61;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_60,
               "Table statistics column count is not aligned with table column count. Corrupt file?"
               ,this_00);
    IOException::IOException((IOException *)this_00,msg);
    __cxa_throw(msg,&IOException::typeinfo,IOException::~IOException);
  }
  return;
}

Assistant:

void TableStatistics::Initialize(const vector<LogicalType> &types, PersistentTableData &data) {
	D_ASSERT(Empty());
	D_ASSERT(!table_sample);

	stats_lock = make_shared_ptr<mutex>();
	column_stats = std::move(data.table_stats.column_stats);
	if (data.table_stats.table_sample) {
		table_sample = std::move(data.table_stats.table_sample);
	} else {
		table_sample = make_uniq<ReservoirSample>(static_cast<idx_t>(FIXED_SAMPLE_SIZE));
	}
	if (column_stats.size() != types.size()) { // LCOV_EXCL_START
		throw IOException("Table statistics column count is not aligned with table column count. Corrupt file?");
	} // LCOV_EXCL_STOP
}